

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O0

Literals * __thiscall
anon_unknown.dwarf_65694::CtorEvalExternalInterface::callTable
          (Literals *__return_storage_ptr__,CtorEvalExternalInterface *this,Name tableName,
          Address index,HeapType sig,Literals *arguments,Type result,EvallingModuleRunner *instance)

{
  Name name;
  bool bVar1;
  FailToEvalException *pFVar2;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *this_00;
  pointer pEVar3;
  ulong uVar4;
  size_type sVar5;
  value_type pEVar6;
  reference ppEVar7;
  address64_t aVar8;
  Name NVar9;
  Name NVar10;
  string local_2c8;
  allocator<char> local_2a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  Literals local_260;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *local_228;
  char *pcStack_220;
  undefined1 local_209;
  string local_208;
  allocator<char> local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *local_1a0;
  size_t local_198;
  Importable *local_190;
  Function *func;
  string local_180;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_112;
  allocator<char> local_111;
  string local_110;
  RefFunc *local_f0;
  RefFunc *get;
  value_type entry;
  size_type end;
  Const *c;
  reference puStack_c8;
  Index start;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *__range2;
  Name targetFunc;
  allocator<char> local_81;
  string local_80;
  address64_t local_60;
  char *local_58;
  long local_50;
  Table *table;
  iterator it;
  CtorEvalExternalInterface *this_local;
  Type result_local;
  HeapType sig_local;
  Address index_local;
  Name tableName_local;
  
  index_local.addr = tableName.super_IString.str._M_len;
  it.
  super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
               )this;
  result_local.id = sig.id;
  sig_local.id = index.addr;
  std::__detail::
  _Node_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
  ::_Node_iterator((_Node_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
                    *)&table);
  local_60 = index_local.addr;
  NVar9.super_IString.str._M_str = (char *)index_local.addr;
  NVar9.super_IString.str._M_len = (size_t)this->wasm;
  local_58 = tableName.super_IString.str._M_str;
  local_50 = ::wasm::Module::getTableOrNull(NVar9);
  if (local_50 == 0) {
    targetFunc.super_IString.str._M_str._3_1_ = 1;
    pFVar2 = (FailToEvalException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"callTable on non-existing table",&local_81);
    FailToEvalException::FailToEvalException(pFVar2,&local_80);
    targetFunc.super_IString.str._M_str._3_1_ = 0;
    __cxa_throw(pFVar2,&(anonymous_namespace)::FailToEvalException::typeinfo,
                FailToEvalException::~FailToEvalException);
  }
  ::wasm::Name::Name((Name *)&__range2);
  this_00 = &this->wasm->elementSegments;
  __end2 = std::
           vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ::begin(this_00);
  segment = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
            std::
            vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                                     *)&segment), bVar1) {
    puStack_c8 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                 ::operator*(&__end2);
    pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(puStack_c8);
    bVar1 = ::wasm::IString::operator!=((IString *)(pEVar3 + 0x18),(IString *)&index_local);
    if (!bVar1) {
      pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
               operator->(puStack_c8);
      end = (size_type)::wasm::Expression::dynCast<wasm::Const>(*(Expression **)(pEVar3 + 0x28));
      if ((Const *)end == (Const *)0x0) {
        pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 operator->(puStack_c8);
        bVar1 = ::wasm::Expression::is<wasm::GlobalGet>(*(Expression **)(pEVar3 + 0x28));
        if (!bVar1) {
          ::wasm::handle_unreachable
                    ("invalid expr type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                     ,0x145);
        }
        c._4_4_ = 0;
      }
      else {
        c._4_4_ = ::wasm::Literal::getInteger();
      }
      uVar4 = (ulong)c._4_4_;
      pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
               operator->(puStack_c8);
      sVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         (pEVar3 + 0x38));
      entry = (value_type)(uVar4 + sVar5);
      uVar4 = (ulong)c._4_4_;
      aVar8 = ::wasm::Address::operator_cast_to_unsigned_long((Address *)&sig_local);
      if ((uVar4 <= aVar8) &&
         (pEVar6 = (value_type)
                   ::wasm::Address::operator_cast_to_unsigned_long((Address *)&sig_local),
         pEVar6 < entry)) {
        pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 operator->(puStack_c8);
        aVar8 = ::wasm::Address::operator_cast_to_unsigned_long((Address *)&sig_local);
        ppEVar7 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             (pEVar3 + 0x38),aVar8 - c._4_4_);
        get = (RefFunc *)*ppEVar7;
        local_f0 = ::wasm::Expression::dynCast<wasm::RefFunc>((Expression *)get);
        if (local_f0 == (RefFunc *)0x0) {
          local_112 = 1;
          pFVar2 = (FailToEvalException *)__cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,"callTable on uninitialized entry",&local_111);
          FailToEvalException::FailToEvalException(pFVar2,&local_110);
          local_112 = 0;
          __cxa_throw(pFVar2,&(anonymous_namespace)::FailToEvalException::typeinfo,
                      FailToEvalException::~FailToEvalException);
        }
        ::wasm::Name::operator=((Name *)&__range2,&local_f0->func);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
    ::operator++(&__end2);
  }
  bVar1 = ::wasm::IString::is((IString *)&__range2);
  if (!bVar1) {
    func._7_1_ = 1;
    pFVar2 = (FailToEvalException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"callTable on index not found in static segments: ",&local_159);
    aVar8 = ::wasm::Address::operator_cast_to_unsigned_long((Address *)&sig_local);
    std::__cxx11::to_string(&local_180,aVar8);
    std::operator+(&local_138,&local_158,&local_180);
    FailToEvalException::FailToEvalException(pFVar2,&local_138);
    func._7_1_ = 0;
    __cxa_throw(pFVar2,&(anonymous_namespace)::FailToEvalException::typeinfo,
                FailToEvalException::~FailToEvalException);
  }
  local_1a0 = __range2;
  local_198 = targetFunc.super_IString.str._M_len;
  NVar10.super_IString.str._M_str = (char *)__range2;
  NVar10.super_IString.str._M_len = (size_t)this->wasm;
  local_190 = (Importable *)::wasm::Module::getFunction(NVar10);
  bVar1 = ::wasm::HeapType::operator!=((HeapType *)(local_190 + 1),(HeapType *)&result_local);
  if (!bVar1) {
    bVar1 = ::wasm::Importable::imported(local_190);
    if (bVar1) {
      pFVar2 = (FailToEvalException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a0,"callTable on imported function: ",&local_2a1);
      ::wasm::IString::toString_abi_cxx11_(&local_2c8,(IString *)&__range2);
      std::operator+(&local_280,&local_2a0,&local_2c8);
      FailToEvalException::FailToEvalException(pFVar2,&local_280);
      __cxa_throw(pFVar2,&(anonymous_namespace)::FailToEvalException::typeinfo,
                  FailToEvalException::~FailToEvalException);
    }
    local_228 = __range2;
    pcStack_220 = (char *)targetFunc.super_IString.str._M_len;
    ::wasm::Literals::Literals(&local_260,arguments);
    name.super_IString.str._M_str = pcStack_220;
    name.super_IString.str._M_len = (size_t)local_228;
    ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::callFunction
              (__return_storage_ptr__,
               &instance->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>,name,
               &local_260);
    ::wasm::Literals::~Literals(&local_260);
    return __return_storage_ptr__;
  }
  local_209 = 1;
  pFVar2 = (FailToEvalException *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"callTable signature mismatch: ",&local_1e1);
  ::wasm::IString::toString_abi_cxx11_(&local_208,(IString *)&__range2);
  std::operator+(&local_1c0,&local_1e0,&local_208);
  FailToEvalException::FailToEvalException(pFVar2,&local_1c0);
  local_209 = 0;
  __cxa_throw(pFVar2,&(anonymous_namespace)::FailToEvalException::typeinfo,
              FailToEvalException::~FailToEvalException);
}

Assistant:

Literals callTable(Name tableName,
                     Address index,
                     HeapType sig,
                     Literals& arguments,
                     Type result,
                     EvallingModuleRunner& instance) override {

    std::unordered_map<wasm::Name, std::vector<wasm::Name>>::iterator it;

    auto* table = wasm->getTableOrNull(tableName);
    if (!table) {
      throw FailToEvalException("callTable on non-existing table");
    }

    // Look through the segments and find the function. Segments can overlap,
    // so we want the last one.
    Name targetFunc;
    for (auto& segment : wasm->elementSegments) {
      if (segment->table != tableName) {
        continue;
      }

      Index start;
      // look for the index in this segment. if it has a constant offset, we
      // look in the proper range. if it instead gets a global, we rely on the
      // fact that when not dynamically linking then the table is loaded at
      // offset 0.
      if (auto* c = segment->offset->dynCast<Const>()) {
        start = c->value.getInteger();
      } else if (segment->offset->is<GlobalGet>()) {
        start = 0;
      } else {
        // wasm spec only allows const and global.get there
        WASM_UNREACHABLE("invalid expr type");
      }
      auto end = start + segment->data.size();
      if (start <= index && index < end) {
        auto entry = segment->data[index - start];
        if (auto* get = entry->dynCast<RefFunc>()) {
          targetFunc = get->func;
        } else {
          throw FailToEvalException(
            std::string("callTable on uninitialized entry"));
        }
      }
    }

    if (!targetFunc.is()) {
      throw FailToEvalException(
        std::string("callTable on index not found in static segments: ") +
        std::to_string(index));
    }

    // If this is one of our functions, we can call it; if it was
    // imported, fail.
    auto* func = wasm->getFunction(targetFunc);
    if (func->type != sig) {
      throw FailToEvalException(std::string("callTable signature mismatch: ") +
                                targetFunc.toString());
    }
    if (!func->imported()) {
      return instance.callFunction(targetFunc, arguments);
    } else {
      throw FailToEvalException(
        std::string("callTable on imported function: ") +
        targetFunc.toString());
    }
  }